

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O3

void __thiscall Minisat::SimpSolver::extendModel(SimpSolver *this)

{
  int iVar1;
  uint *puVar2;
  lbool *plVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  
  iVar1 = (this->elimclauses).sz;
  if (1 < iVar1) {
    uVar5 = iVar1 - 1;
    do {
      puVar2 = (this->elimclauses).data;
      uVar7 = puVar2[uVar5];
      uVar6 = uVar5 - 1;
      plVar3 = (this->super_Solver).model.data;
      if (1 < (int)uVar7) {
        puVar8 = puVar2 + uVar6;
        do {
          if (((byte)*puVar8 & 1 ^ plVar3[(int)*puVar8 >> 1].value) != 1) goto LAB_00127ecb;
          uVar6 = uVar6 - 1;
          puVar8 = puVar8 + -1;
          bVar4 = 2 < (int)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar4);
        uVar7 = 1;
      }
      plVar3[(int)puVar2[(int)uVar6] >> 1].value = (byte)puVar2[(int)uVar6] & 1;
LAB_00127ecb:
      uVar5 = uVar6 - uVar7;
    } while (uVar5 != 0 && (int)uVar7 <= (int)uVar6);
  }
  return;
}

Assistant:

int size(void) const { return sz; }